

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::MemoryImport::~MemoryImport(MemoryImport *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ImportMixin<(wabt::ExternalKind)2>).super_Import._vptr_Import =
       (_func_int **)&PTR__MemoryImport_001a4578;
  pcVar2 = (this->memory).name._M_dataplus._M_p;
  paVar1 = &(this->memory).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Import::~Import((Import *)this);
  operator_delete(this,0x90);
  return;
}

Assistant:

explicit MemoryImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Memory>(), memory(name) {}